

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O1

shared_ptr<mprpc::MpRpcMessage> __thiscall
mprpc::MpRpcClient::call(MpRpcClient *this,char *method,char *params,size_t params_size,int timeout)

{
  int *piVar1;
  int iVar2;
  undefined8 uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000084;
  int in_R9D;
  shared_ptr<mprpc::MpRpcMessage> sVar5;
  unique_lock<std::mutex> lock;
  condition_variable cond;
  mutex mtx;
  undefined1 local_108 [40];
  undefined1 local_e0;
  _Any_data local_d8;
  atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
  local_c8;
  atomic<unsigned_long> aStack_c0;
  _Any_data local_b8;
  ImplicitProducerHash *local_a8;
  atomic<unsigned_long> aStack_a0;
  undefined1 local_90 [56];
  __base_type local_58;
  atomic<moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducerHash_*>
  aStack_50;
  atomic<unsigned_long> local_48;
  atomic<unsigned_long> aStack_40;
  ImplicitProducer *local_38;
  
  local_108._28_4_ = in_register_00000084;
  local_108._24_4_ = (__atomic_base<unsigned_int>)(__atomic_base<unsigned_int>)timeout;
  LOCK();
  piVar1 = (int *)(method + 0x548);
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  if (in_R9D == 0) {
    asnyc_call_abi_cxx11_((MpRpcClient *)local_90,method,params,params_size,timeout);
    LOCK();
    *(int *)local_90._0_8_ = *(int *)local_90._0_8_ + -1;
    UNLOCK();
    (this->super_Connection_Callback)._vptr_Connection_Callback = (_func_int **)0x0;
    (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)0x0;
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    local_48.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    aStack_40.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_58._M_p = (__pointer_type)0x0;
    aStack_50._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_38 = (ImplicitProducer *)0x0;
    local_108._16_8_ = params;
    std::condition_variable::condition_variable((condition_variable *)(local_90 + 8));
    (this->super_Connection_Callback)._vptr_Connection_Callback = (_func_int **)0x0;
    (this->super_MsgLoopRun)._vptr_MsgLoopRun = (_func_int **)0x0;
    local_e0 = 0;
    local_108._8_8_ = this;
    local_108._32_8_ = &local_58;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_108 + 0x20));
    local_e0 = 1;
    asnyc_call_abi_cxx11_
              ((MpRpcClient *)local_108,method,(char *)local_108._16_8_,params_size,
               (__int_type_conflict2)(__int_type_conflict2)local_108._24_8_);
    this = (MpRpcClient *)local_108._8_8_;
    uVar3 = local_108._0_8_;
    LOCK();
    *(int *)local_108._0_8_ = *(int *)local_108._0_8_ + 1;
    UNLOCK();
    local_a8 = (ImplicitProducerHash *)0x0;
    aStack_a0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = (ImplicitProducerKVP *)0x0;
    local_b8._M_unused._M_object = operator_new(0x18);
    *(__base_type **)local_b8._M_unused._0_8_ = &local_58;
    *(undefined1 **)((long)local_b8._M_unused._0_8_ + 8) = local_90 + 8;
    *(MpRpcClient **)((long)local_b8._M_unused._0_8_ + 0x10) = this;
    aStack_a0.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         std::
         _Function_handler<void_(std::shared_ptr<mprpc::MpRpcMessage>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:267:29)>
         ::_M_invoke;
    local_a8 = (ImplicitProducerHash *)
               std::
               _Function_handler<void_(std::shared_ptr<mprpc::MpRpcMessage>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:267:29)>
               ::_M_manager;
    *(_func_int **)(uVar3 + 0x10) = (_func_int *)0x0;
    std::function<void_(std::shared_ptr<mprpc::MpRpcMessage>)>::operator=
              ((function<void_(std::shared_ptr<mprpc::MpRpcMessage>)> *)(uVar3 + 0x18),
               (function<void_(std::shared_ptr<mprpc::MpRpcMessage>)> *)&local_b8);
    LOCK();
    *(int *)uVar3 = *(int *)uVar3 + 1;
    UNLOCK();
    local_c8._M_b._M_p = (__base_type)(__pointer_type)0x0;
    aStack_c0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    local_d8._M_unused._M_object = (void *)0x0;
    local_d8._8_8_ = (__pointer_type)0x0;
    local_d8._M_unused._M_object = operator_new(0x28);
    *(int *)local_d8._M_unused._0_8_ = iVar2 + 1;
    ((__base_type *)((long)local_d8._M_unused._0_8_ + 8))->_M_p = (__pointer_type)local_108._16_8_;
    *(__base_type **)((long)local_d8._M_unused._0_8_ + 0x10) = &local_58;
    *(undefined1 **)((long)local_d8._M_unused._0_8_ + 0x18) = local_90 + 8;
    *(MpRpcClient **)((long)local_d8._M_unused._0_8_ + 0x20) = this;
    aStack_c0.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         std::
         _Function_handler<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:272:29)>
         ::_M_invoke;
    local_c8._M_b._M_p =
         (__base_type)
         std::
         _Function_handler<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:272:29)>
         ::_M_manager;
    *(_func_int **)(uVar3 + 0x38) = (_func_int *)0x0;
    std::
    function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::operator=((function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                 *)(uVar3 + 0x40),
                (function<void_(std::shared_ptr<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                 *)&local_d8);
    LOCK();
    *(int *)uVar3 = *(int *)uVar3 + 1;
    UNLOCK();
    LOCK();
    *(int *)uVar3 = *(int *)uVar3 + -1;
    UNLOCK();
    if (local_c8._M_b._M_p != (__pointer_type)0x0) {
      (*(code *)local_c8._M_b._M_p)(&local_d8,&local_d8,3);
    }
    LOCK();
    *(int *)uVar3 = *(int *)uVar3 + -1;
    UNLOCK();
    if (local_a8 != (ImplicitProducerHash *)0x0) {
      (*(code *)local_a8)(&local_b8,&local_b8,3);
    }
    LOCK();
    *(int *)uVar3 = *(int *)uVar3 + -1;
    UNLOCK();
    LOCK();
    *(int *)local_108._0_8_ = *(int *)local_108._0_8_ + -1;
    UNLOCK();
    std::condition_variable::wait((unique_lock *)(local_90 + 8));
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_108 + 0x20));
    std::condition_variable::~condition_variable((condition_variable *)(local_90 + 8));
    _Var4._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mprpc::MpRpcMessage>)
         sVar5.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<MpRpcMessage> MpRpcClient::call(const char* method, const char* params, size_t params_size, int timeout)
    {
        int callid = ++m_cur_callid;

        if (!timeout) {
            asnyc_call(method, params, params_size, timeout);
            return nullptr;
        } else {
            mutex mtx;
            condition_variable  cond;
            shared_ptr<MpRpcMessage> rsp_msg;

            unique_lock<mutex> lock(mtx);

            asnyc_call(method, params, params_size, timeout)
                .in_loop(nullptr)
                .on_success([&mtx, &cond, &rsp_msg](shared_ptr<MpRpcMessage> msg) {
                    unique_lock<mutex> lock(mtx);
                    rsp_msg = msg;
                    cond.notify_one();
                })
                .on_failure([callid, method, &mtx, &cond, &rsp_msg](shared_ptr<pair<int, string>> e) {
                    auto rsp = make_shared<MpRpcMessage>();
                    rsp->err_code = e->first;
                    rsp->err_msg = e->second;
                    rsp->id = callid;
                    rsp->method = method;
                    unique_lock<mutex> lock(mtx);
                    rsp_msg = rsp;
                    cond.notify_one();
                });
        

            cond.wait(lock);
            return rsp_msg;
        }
    }